

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O1

void __thiscall
QHttpThreadDelegate::finishedWithErrorSlot
          (QHttpThreadDelegate *this,NetworkError errorCode,QString *detail)

{
  long in_FS_OFFSET;
  NetworkError local_50 [2];
  void *local_48;
  QHttpNetworkReply *pQStack_40;
  QMetaTypeInterface *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x150) != 0) {
    if (this[0x10] == (QHttpThreadDelegate)0x1) {
      QHttpNetworkReply::sslConfiguration((QHttpNetworkReply *)local_50);
      local_48 = (void *)0x0;
      pQStack_40 = (QHttpNetworkReply *)local_50;
      QMetaObject::activate((QObject *)this,&staticMetaObject,4,&local_48);
      QSslConfiguration::~QSslConfiguration((QSslConfiguration *)local_50);
    }
    local_48 = (void *)0x0;
    local_50[0] = errorCode;
    pQStack_40 = (QHttpNetworkReply *)local_50;
    local_38 = (QMetaTypeInterface *)detail;
    QMetaObject::activate((QObject *)this,&staticMetaObject,0xb,&local_48);
    QMetaObject::activate((QObject *)this,&staticMetaObject,0xc,(void **)0x0);
    local_48 = (void *)0x0;
    pQStack_40 = (QHttpNetworkReply *)0x0;
    local_38 = (QMetaTypeInterface *)0x0;
    QMetaObject::invokeMethodImpl
              (*(QObject **)(this + 0x150),"deleteLater",QueuedConnection,1,&local_48,
               (char **)&pQStack_40,&local_38);
    local_48 = (void *)0x0;
    pQStack_40 = (QHttpNetworkReply *)0x0;
    local_38 = (QMetaTypeInterface *)0x0;
    QMetaObject::invokeMethodImpl
              ((QObject *)this,"deleteLater",QueuedConnection,1,&local_48,(char **)&pQStack_40,
               &local_38);
    *(undefined8 *)(this + 0x150) = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::finishedWithErrorSlot(QNetworkReply::NetworkError errorCode, const QString &detail)
{
    if (!httpReply)
        return;

#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::finishedWithErrorSlot() thread=" << QThread::currentThreadId() << "error=" << errorCode << detail;
#endif

#ifndef QT_NO_SSL
    if (ssl)
        emit sslConfigurationChanged(httpReply->sslConfiguration());
#endif
    emit error(errorCode,detail);
    emit downloadFinished();


    QMetaObject::invokeMethod(httpReply, "deleteLater", Qt::QueuedConnection);
    QMetaObject::invokeMethod(this, "deleteLater", Qt::QueuedConnection);
    httpReply = nullptr;
}